

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::MapTest_CopyConstructStrings_Test::TestBody
          (MapTest_CopyConstructStrings_Test *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *pcVar3;
  AssertHelper local_178;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_5;
  Message local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_4;
  Message local_130;
  int local_124;
  size_type local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_100 [8];
  MapType map2;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_98;
  Message local_90;
  int local_84;
  size_type local_80;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  MapType map1;
  undefined1 local_38 [8];
  MapType original;
  InternalVisibilityForTesting token;
  MapTest_CopyConstructStrings_Test *this_local;
  
  original.
  super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_UntypedMapBase.arena_._7_1_ = 0;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Map((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_38);
  pbVar2 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[]<char[2]>
                     ((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_38,(key_arg<char[2]> *)0x1eb4591);
  std::__cxx11::string::operator=((string *)pbVar2,"2");
  pbVar2 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[]<char[2]>
                     ((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_38,(key_arg<char[2]> *)0x1eed7d5);
  std::__cxx11::string::operator=((string *)pbVar2,"3");
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Map((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar.message_,
        (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_38);
  local_80 = UntypedMapBase::size((UntypedMapBase *)&gtest_ar.message_);
  local_84 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_78,"map1.size()","2",&local_80,&local_84);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test.cc"
               ,0x55,pcVar3);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(&local_90);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pbVar2 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[]<char[2]>
                       ((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar.message_,(key_arg<char[2]> *)0x1eb4591);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
              ((EqHelper *)local_b0,"map1[\"1\"]","\"2\"",pbVar2,(char (*) [2])0x1eed7d5);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test.cc"
                 ,0x56,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
    pbVar2 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[]<char[2]>
                       ((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar.message_,(key_arg<char[2]> *)0x1eed7d5);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
              ((EqHelper *)local_d0,"map1[\"2\"]","\"3\"",pbVar2,(char (*) [2])0x1ce96ec);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
    if (!bVar1) {
      testing::Message::Message(&local_d8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &map2.
                  super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .super_UntypedMapBase.arena_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test.cc"
                 ,0x57,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &map2.
                  super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .super_UntypedMapBase.arena_,&local_d8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &map2.
                  super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  .super_UntypedMapBase.arena_);
      testing::Message::~Message(&local_d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
    InternalVisibilityForTesting::operator_cast_to_InternalVisibility
              ((InternalVisibilityForTesting *)
               ((long)&original.
                       super_KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       .super_UntypedMapBase.arena_ + 7));
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Map((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)local_100,0,local_38);
    local_120 = UntypedMapBase::size((UntypedMapBase *)local_100);
    local_124 = 2;
    testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
              ((EqHelper *)local_118,"map2.size()","2",&local_120,&local_124);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_130);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test.cc"
                 ,0x5a,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_130);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_130);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      pbVar2 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[]<char[2]>
                         ((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_100,(key_arg<char[2]> *)0x1eb4591);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
                ((EqHelper *)local_148,"map2[\"1\"]","\"2\"",pbVar2,(char (*) [2])0x1eed7d5);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
      if (!bVar1) {
        testing::Message::Message(&local_150);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test.cc"
                   ,0x5b,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_150);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_150);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
      pbVar2 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator[]<char[2]>
                         ((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_100,(key_arg<char[2]> *)0x1eed7d5);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
                ((EqHelper *)local_168,"map2[\"2\"]","\"3\"",pbVar2,(char (*) [2])0x1ce96ec);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
      if (!bVar1) {
        testing::Message::Message(&local_170);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_test.cc"
                   ,0x5c,pcVar3);
        testing::internal::AssertHelper::operator=(&local_178,&local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        testing::Message::~Message(&local_170);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Map((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_100);
  }
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Map((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&gtest_ar.message_);
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Map((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_38);
  return;
}

Assistant:

TEST(MapTest, CopyConstructStrings) {
  auto token = internal::InternalVisibilityForTesting{};
  using MapType = Map<std::string, std::string>;
  MapType original;
  original["1"] = "2";
  original["2"] = "3";

  MapType map1(original);
  ASSERT_EQ(map1.size(), 2);
  EXPECT_EQ(map1["1"], "2");
  EXPECT_EQ(map1["2"], "3");

  MapType map2(token, nullptr, original);
  ASSERT_EQ(map2.size(), 2);
  EXPECT_EQ(map2["1"], "2");
  EXPECT_EQ(map2["2"], "3");
}